

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpip-forward.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  ssize_t sVar8;
  bool local_4181;
  ssize_t nsent;
  ssize_t nwritten;
  fd_set *__arr;
  undefined1 local_4110 [4];
  uint __i;
  fd_set fds;
  libssh2_socket_t forwardsock;
  libssh2_socket_t sock;
  char buf [16384];
  ssize_t wr;
  ssize_t len;
  timeval tv;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_LISTENER *listener;
  LIBSSH2_SESSION *session;
  int rc;
  char *userauthlist;
  char *fingerprint;
  undefined1 local_30 [4];
  socklen_t sinlen;
  sockaddr_in sin;
  int auth;
  int i;
  char **argv_local;
  int argc_local;
  
  sin.sin_zero[0] = '\0';
  sin.sin_zero[1] = '\0';
  sin.sin_zero[2] = '\0';
  sin.sin_zero[3] = '\0';
  listener = (LIBSSH2_LISTENER *)0x0;
  channel = (LIBSSH2_CHANNEL *)0x0;
  tv.tv_usec = 0;
  fds.__fds_bits[0xf]._0_4_ = -1;
  if (1 < argc) {
    server_ip = argv[1];
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  if (4 < argc) {
    remote_listenhost = argv[4];
  }
  if (5 < argc) {
    remote_wantport = atoi(argv[5]);
  }
  if (6 < argc) {
    local_destip = argv[6];
  }
  if (7 < argc) {
    local_destport = atoi(argv[7]);
  }
  uVar1 = libssh2_init(0);
  if (uVar1 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar1);
    return 1;
  }
  fds.__fds_bits[0xf]._4_4_ = socket(2,1,6);
  if (fds.__fds_bits[0xf]._4_4_ == -1) {
    fprintf(_stderr,"failed to open socket.\n");
  }
  else {
    local_30._0_2_ = 2;
    sinlen = inet_addr(server_ip);
    if (sinlen == 0xffffffff) {
      fprintf(_stderr,"inet_addr: Invalid IP address \'%s\'\n",server_ip);
    }
    else {
      local_30._2_2_ = htons(0x16);
      iVar2 = connect(fds.__fds_bits[0xf]._4_4_,(sockaddr *)local_30,0x10);
      __stream = _stderr;
      if (iVar2 == 0) {
        listener = (LIBSSH2_LISTENER *)libssh2_session_init_ex(0,0,0);
        if (listener == (LIBSSH2_LISTENER *)0x0) {
          fprintf(_stderr,"Could not initialize SSH session.\n");
        }
        else {
          uVar1 = libssh2_session_handshake(listener,fds.__fds_bits[0xf]._4_4_);
          if (uVar1 == 0) {
            lVar4 = libssh2_hostkey_hash(listener,2);
            fprintf(_stderr,"Fingerprint: ");
            sin.sin_zero[4] = '\0';
            sin.sin_zero[5] = '\0';
            sin.sin_zero[6] = '\0';
            sin.sin_zero[7] = '\0';
            for (; (int)sin.sin_zero._4_4_ < 0x14; sin.sin_zero._4_4_ = sin.sin_zero._4_4_ + 1) {
              fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar4 + (int)sin.sin_zero._4_4_));
            }
            fprintf(_stderr,"\n");
            pcVar3 = username;
            sVar5 = strlen(username);
            pcVar3 = (char *)libssh2_userauth_list(listener,pcVar3,sVar5 & 0xffffffff);
            if (pcVar3 != (char *)0x0) {
              fprintf(_stderr,"Authentication methods: %s\n",pcVar3);
              pcVar6 = strstr(pcVar3,"password");
              if (pcVar6 != (char *)0x0) {
                sin.sin_zero._0_4_ = sin.sin_zero._0_4_ | 1;
              }
              pcVar3 = strstr(pcVar3,"publickey");
              if (pcVar3 != (char *)0x0) {
                sin.sin_zero._0_4_ = sin.sin_zero._0_4_ | 2;
              }
              if (8 < argc) {
                if (((sin.sin_zero._0_4_ & 1) != 0) && (iVar2 = strcmp(argv[8],"-p"), iVar2 == 0)) {
                  sin.sin_zero[0] = '\x01';
                  sin.sin_zero[1] = '\0';
                  sin.sin_zero[2] = '\0';
                  sin.sin_zero[3] = '\0';
                }
                if (((sin.sin_zero._0_4_ & 2) != 0) && (iVar2 = strcmp(argv[8],"-k"), iVar2 == 0)) {
                  sin.sin_zero[0] = '\x02';
                  sin.sin_zero[1] = '\0';
                  sin.sin_zero[2] = '\0';
                  sin.sin_zero[3] = '\0';
                }
              }
              pcVar3 = username;
              if ((sin.sin_zero._0_4_ & 1) == 0) {
                if ((sin.sin_zero._0_4_ & 2) == 0) {
                  fprintf(_stderr,"No supported authentication methods found.\n");
                  goto LAB_00101ddf;
                }
                sVar5 = strlen(username);
                iVar2 = libssh2_userauth_publickey_fromfile_ex
                                  (listener,pcVar3,sVar5 & 0xffffffff,pubkey,privkey,password);
                if (iVar2 != 0) {
                  fprintf(_stderr,"Authentication by public key failed.\n");
                  goto LAB_00101ddf;
                }
                fprintf(_stderr,"Authentication by public key succeeded.\n");
              }
              else {
                sVar5 = strlen(username);
                pcVar6 = password;
                sVar7 = strlen(password);
                iVar2 = libssh2_userauth_password_ex
                                  (listener,pcVar3,sVar5 & 0xffffffff,pcVar6,sVar7 & 0xffffffff,0);
                if (iVar2 != 0) {
                  fprintf(_stderr,"Authentication by password failed.\n");
                  goto LAB_00101ddf;
                }
              }
            }
            fprintf(_stderr,"Asking server to listen on remote %s:%d\n",remote_listenhost,
                    (ulong)(uint)remote_wantport);
            channel = (LIBSSH2_CHANNEL *)
                      libssh2_channel_forward_listen_ex
                                (listener,remote_listenhost,remote_wantport,&remote_listenport,1);
            if (channel == (LIBSSH2_CHANNEL *)0x0) {
              fprintf(_stderr,
                      "Could not start the tcpip-forward listener.\n(Note that this can be a problem at the server. Please review the server logs.)\n"
                     );
            }
            else {
              fprintf(_stderr,"Server is listening on %s:%d\n",remote_listenhost,
                      (ulong)(uint)remote_listenport);
              fprintf(_stderr,"Waiting for remote connection\n");
              tv.tv_usec = libssh2_channel_forward_accept(channel);
              if (tv.tv_usec == 0) {
                fprintf(_stderr,
                        "Could not accept connection.\n(Note that this can be a problem at the server. Please review the server logs.)\n"
                       );
              }
              else {
                fprintf(_stderr,"Accepted remote connection. Connecting to local server %s:%d\n",
                        local_destip,(ulong)(uint)local_destport);
                fds.__fds_bits[0xf]._0_4_ = socket(2,1,6);
                if ((int)fds.__fds_bits[0xf] == -1) {
                  fprintf(_stderr,"failed to open forward socket.\n");
                }
                else {
                  local_30._0_2_ = 2;
                  local_30._2_2_ = htons((uint16_t)local_destport);
                  sinlen = inet_addr(local_destip);
                  if (sinlen == 0xffffffff) {
                    fprintf(_stderr,"failed in inet_addr().\n");
                  }
                  else {
                    iVar2 = connect((int)fds.__fds_bits[0xf],(sockaddr *)local_30,0x10);
                    if (iVar2 != -1) {
                      fprintf(_stderr,"Forwarding connection from remote %s:%d to local %s:%d\n",
                              remote_listenhost,(ulong)(uint)remote_listenport,local_destip,
                              (ulong)(uint)local_destport);
                      libssh2_session_set_blocking(listener,0);
                      do {
                        for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
                          *(undefined8 *)(local_4110 + (ulong)__arr._4_4_ * 8) = 0;
                        }
                        *(ulong *)(local_4110 + (long)((int)fds.__fds_bits[0xf] / 0x40) * 8) =
                             1L << ((byte)((long)(int)fds.__fds_bits[0xf] % 0x40) & 0x3f) |
                             *(ulong *)(local_4110 + (long)((int)fds.__fds_bits[0xf] / 0x40) * 8);
                        len = 0;
                        tv.tv_sec = 100000;
                        iVar2 = select((int)fds.__fds_bits[0xf] + 1,(fd_set *)local_4110,
                                       (fd_set *)0x0,(fd_set *)0x0,(timeval *)&len);
                        if (iVar2 == -1) {
                          fprintf(_stderr,"failed to select().\n");
                          goto LAB_00101ddf;
                        }
                        if ((iVar2 != 0) &&
                           ((*(ulong *)(local_4110 + (long)((int)fds.__fds_bits[0xf] / 0x40) * 8) &
                            1L << ((byte)((long)(int)fds.__fds_bits[0xf] % 0x40) & 0x3f)) != 0)) {
                          sVar8 = recv((int)fds.__fds_bits[0xf],&forwardsock,0x4000,0);
                          if (sVar8 < 0) {
                            fprintf(_stderr,"failed to recv().\n");
                            goto LAB_00101ddf;
                          }
                          if (sVar8 == 0) {
                            fprintf(_stderr,"The local server at %s:%d disconnected.\n",local_destip
                                    ,(ulong)(uint)local_destport);
                            goto LAB_00101ddf;
                          }
                          buf[0x3ff8] = '\0';
                          buf[0x3ff9] = '\0';
                          buf[0x3ffa] = '\0';
                          buf[0x3ffb] = '\0';
                          buf[0x3ffc] = '\0';
                          buf[0x3ffd] = '\0';
                          buf[0x3ffe] = '\0';
                          buf[0x3fff] = '\0';
                          do {
                            lVar4 = libssh2_channel_write_ex(tv.tv_usec,0,&forwardsock,sVar8);
                            if (lVar4 < 0) {
                              fprintf(_stderr,"libssh2_channel_write: %ld\n",lVar4);
                              goto LAB_00101ddf;
                            }
                            buf._16376_8_ = lVar4 + buf._16376_8_;
                            local_4181 = 0 < lVar4 && (long)buf._16376_8_ < sVar8;
                          } while (local_4181);
                        }
                        while (lVar4 = libssh2_channel_read_ex(tv.tv_usec,0,&forwardsock),
                              lVar4 != -0x25) {
                          if (lVar4 < 0) {
                            fprintf(_stderr,"libssh2_channel_read: %ld",lVar4);
                            goto LAB_00101ddf;
                          }
                          buf[0x3ff8] = '\0';
                          buf[0x3ff9] = '\0';
                          buf[0x3ffa] = '\0';
                          buf[0x3ffb] = '\0';
                          buf[0x3ffc] = '\0';
                          buf[0x3ffd] = '\0';
                          buf[0x3ffe] = '\0';
                          buf[0x3fff] = '\0';
                          for (; (long)buf._16376_8_ < lVar4; buf._16376_8_ = sVar8 + buf._16376_8_)
                          {
                            sVar8 = send((int)fds.__fds_bits[0xf],
                                         (void *)((long)&forwardsock + buf._16376_8_),
                                         lVar4 - buf._16376_8_,0);
                            if (sVar8 < 1) {
                              fprintf(_stderr,"failed to send().\n");
                              goto LAB_00101ddf;
                            }
                          }
                          iVar2 = libssh2_channel_eof(tv.tv_usec);
                          if (iVar2 != 0) {
                            fprintf(_stderr,"The remote client at %s:%d disconnected.\n",
                                    remote_listenhost,(ulong)(uint)remote_listenport);
                            goto LAB_00101ddf;
                          }
                        }
                      } while( true );
                    }
                    fprintf(_stderr,"failed to connect().\n");
                  }
                }
              }
            }
          }
          else {
            fprintf(_stderr,"Error when starting up SSH session: %d\n",(ulong)uVar1);
          }
        }
      }
      else {
        pcVar3 = inet_ntoa((in_addr)sinlen);
        fprintf(__stream,"Failed to connect to %s.\n",pcVar3);
      }
    }
  }
LAB_00101ddf:
  if ((int)fds.__fds_bits[0xf] != -1) {
    shutdown((int)fds.__fds_bits[0xf],2);
    close((int)fds.__fds_bits[0xf]);
  }
  if (tv.tv_usec != 0) {
    libssh2_channel_free(tv.tv_usec);
  }
  if (channel != (LIBSSH2_CHANNEL *)0x0) {
    libssh2_channel_forward_cancel(channel);
  }
  if (listener != (LIBSSH2_LISTENER *)0x0) {
    libssh2_session_disconnect_ex(listener,0xb,"Normal Shutdown","");
    libssh2_session_free(listener);
  }
  if (fds.__fds_bits[0xf]._4_4_ != -1) {
    shutdown(fds.__fds_bits[0xf]._4_4_,2);
    close(fds.__fds_bits[0xf]._4_4_);
  }
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    int i, auth = AUTH_NONE;
    struct sockaddr_in sin;
    socklen_t sinlen = sizeof(sin);
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_LISTENER *listener = NULL;
    LIBSSH2_CHANNEL *channel = NULL;
    struct timeval tv;
    ssize_t len, wr;
    char buf[16384];
    libssh2_socket_t sock;
    libssh2_socket_t forwardsock = LIBSSH2_INVALID_SOCKET;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1)
        server_ip = argv[1];
    if(argc > 2)
        username = argv[2];
    if(argc > 3)
        password = argv[3];
    if(argc > 4)
        remote_listenhost = argv[4];
    if(argc > 5)
        remote_wantport = atoi(argv[5]);
    if(argc > 6)
        local_destip = argv[6];
    if(argc > 7)
        local_destport = atoi(argv[7]);

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /* Connect to SSH server */
    sock = socket(PF_INET, SOCK_STREAM, IPPROTO_TCP);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to open socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_addr.s_addr = inet_addr(server_ip);
    if(INADDR_NONE == sin.sin_addr.s_addr) {
        fprintf(stderr, "inet_addr: Invalid IP address '%s'\n", server_ip);
        goto shutdown;
    }
    sin.sin_port = htons(22);
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "Failed to connect to %s.\n", inet_ntoa(sin.sin_addr));
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Error when starting up SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++)
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(strstr(userauthlist, "password"))
            auth |= AUTH_PASSWORD;
        if(strstr(userauthlist, "publickey"))
            auth |= AUTH_PUBLICKEY;

        /* check for options */
        if(argc > 8) {
            if((auth & AUTH_PASSWORD) && !strcmp(argv[8], "-p"))
                auth = AUTH_PASSWORD;
            if((auth & AUTH_PUBLICKEY) && !strcmp(argv[8], "-k"))
                auth = AUTH_PUBLICKEY;
        }

        if(auth & AUTH_PASSWORD) {
            if(libssh2_userauth_password(session, username, password)) {
                fprintf(stderr, "Authentication by password failed.\n");
                goto shutdown;
            }
        }
        else if(auth & AUTH_PUBLICKEY) {
            if(libssh2_userauth_publickey_fromfile(session, username,
                                                   pubkey, privkey,
                                                   password)) {
                fprintf(stderr, "Authentication by public key failed.\n");
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by public key succeeded.\n");
            }
        }
        else {
            fprintf(stderr, "No supported authentication methods found.\n");
            goto shutdown;
        }
    }

    fprintf(stderr, "Asking server to listen on remote %s:%d\n",
            remote_listenhost, remote_wantport);

    listener = libssh2_channel_forward_listen_ex(session, remote_listenhost,
                                                 remote_wantport,
                                                 &remote_listenport, 1);
    if(!listener) {
        fprintf(stderr, "Could not start the tcpip-forward listener.\n"
                        "(Note that this can be a problem at the server."
                        " Please review the server logs.)\n");
        goto shutdown;
    }

    fprintf(stderr, "Server is listening on %s:%d\n", remote_listenhost,
            remote_listenport);

    fprintf(stderr, "Waiting for remote connection\n");
    channel = libssh2_channel_forward_accept(listener);
    if(!channel) {
        fprintf(stderr, "Could not accept connection.\n"
                        "(Note that this can be a problem at the server."
                        " Please review the server logs.)\n");
        goto shutdown;
    }

    fprintf(stderr,
            "Accepted remote connection. Connecting to local server %s:%d\n",
            local_destip, local_destport);
    forwardsock = socket(PF_INET, SOCK_STREAM, IPPROTO_TCP);
    if(forwardsock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to open forward socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons((unsigned short)local_destport);
    sin.sin_addr.s_addr = inet_addr(local_destip);
    if(INADDR_NONE == sin.sin_addr.s_addr) {
        fprintf(stderr, "failed in inet_addr().\n");
        goto shutdown;
    }
    if(-1 == connect(forwardsock, (struct sockaddr *)&sin, sinlen)) {
        fprintf(stderr, "failed to connect().\n");
        goto shutdown;
    }

    fprintf(stderr, "Forwarding connection from remote %s:%d to local %s:%d\n",
            remote_listenhost, remote_listenport,
            local_destip, local_destport);

    /* Must use non-blocking IO hereafter due to the current libssh2 API */
    libssh2_session_set_blocking(session, 0);

    for(;;) {
        fd_set fds;
        FD_ZERO(&fds);
#if defined(__GNUC__) || defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-conversion"
#endif
        FD_SET(forwardsock, &fds);
#if defined(__GNUC__) || defined(__clang__)
#pragma GCC diagnostic pop
#endif
        tv.tv_sec = 0;
        tv.tv_usec = 100000;
        rc = select((int)(forwardsock + 1), &fds, NULL, NULL, &tv);
        if(-1 == rc) {
            fprintf(stderr, "failed to select().\n");
            goto shutdown;
        }
#if defined(__GNUC__) || defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-conversion"
#endif
        if(rc && FD_ISSET(forwardsock, &fds)) {
#if defined(__GNUC__) || defined(__clang__)
#pragma GCC diagnostic pop
#endif
            ssize_t nwritten;
            len = recv(forwardsock, buf, sizeof(buf), 0);
            if(len < 0) {
                fprintf(stderr, "failed to recv().\n");
                goto shutdown;
            }
            else if(len == 0) {
                fprintf(stderr, "The local server at %s:%d disconnected.\n",
                        local_destip, local_destport);
                goto shutdown;
            }
            wr = 0;
            do {
                nwritten = libssh2_channel_write(channel, buf, (size_t)len);
                if(nwritten < 0) {
                    fprintf(stderr, "libssh2_channel_write: %ld\n",
                            (long)nwritten);
                    goto shutdown;
                }
                wr += nwritten;
            } while(nwritten > 0 && wr < len);
        }
        for(;;) {
            ssize_t nsent;
            len = libssh2_channel_read(channel, buf, sizeof(buf));
            if(LIBSSH2_ERROR_EAGAIN == len)
                break;
            else if(len < 0) {
                fprintf(stderr, "libssh2_channel_read: %ld",
                        (long)len);
                goto shutdown;
            }
            wr = 0;
            while(wr < len) {
                nsent = send(forwardsock, buf + wr, (size_t)(len - wr), 0);
                if(nsent <= 0) {
                    fprintf(stderr, "failed to send().\n");
                    goto shutdown;
                }
                wr += nsent;
            }
            if(libssh2_channel_eof(channel)) {
                fprintf(stderr, "The remote client at %s:%d disconnected.\n",
                        remote_listenhost, remote_listenport);
                goto shutdown;
            }
        }
    }

shutdown:

    if(forwardsock != LIBSSH2_INVALID_SOCKET) {
        shutdown(forwardsock, 2);
        LIBSSH2_SOCKET_CLOSE(forwardsock);
    }

    if(channel)
        libssh2_channel_free(channel);

    if(listener)
        libssh2_channel_forward_cancel(listener);

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}